

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

int __thiscall
duckdb_re2::RepetitionWalker::PreVisit(RepetitionWalker *this,Regexp *re,int parent_arg,bool *stop)

{
  int iVar1;
  int arg;
  
  if (re->op_ == '\n') {
    iVar1 = (re->arguments).repeat.max_;
    if (iVar1 < 0) {
      iVar1 = (re->arguments).repeat.min_;
    }
    if (0 < iVar1) {
      parent_arg = parent_arg / iVar1;
    }
  }
  return parent_arg;
}

Assistant:

int RepetitionWalker::PreVisit(Regexp* re, int parent_arg, bool* stop) {
  int arg = parent_arg;
  if (re->op() == kRegexpRepeat) {
    int m = re->max();
    if (m < 0) {
      m = re->min();
    }
    if (m > 0) {
      arg /= m;
    }
  }
  return arg;
}